

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
duckdb::CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Deserialize(CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *__return_storage_ptr__,Deserializer *deserializer)

{
  __return_storage_ptr__->set_by_user = false;
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_string_length = 0;
  (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,100,"set_by_user",&__return_storage_ptr__->set_by_user);
  Deserializer::ReadProperty<std::__cxx11::string>
            (deserializer,0x65,"value",&__return_storage_ptr__->value);
  return __return_storage_ptr__;
}

Assistant:

CSVOption<T> CSVOption<T>::Deserialize(Deserializer &deserializer) {
	CSVOption<T> result;
	deserializer.ReadPropertyWithDefault<bool>(100, "set_by_user", result.set_by_user);
	deserializer.ReadProperty<T>(101, "value", result.value);
	return result;
}